

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::paintEvent(QWizard *this,QPaintEvent *event)

{
  QWizardPrivate *this_00;
  QWizardPage *pQVar1;
  ulong uVar2;
  QPainter *in_RSI;
  QWizard *in_RDI;
  long in_FS_OFFSET;
  QWizardPrivate *d;
  QStylePainter painter;
  QPixmap backgroundPixmap;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  QWizard *pQVar3;
  WizardPixmap which;
  QWizardPage *in_stack_ffffffffffffffc8;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QWizard *)0x7bc78f);
  which = (WizardPixmap)((ulong)pQVar3 >> 0x20);
  if ((this_00->wizStyle == MacStyle) &&
     (pQVar1 = currentPage(in_RDI), pQVar1 != (QWizardPage *)0x0)) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    currentPage(in_RDI);
    QWizardPage::pixmap(in_stack_ffffffffffffffc8,which);
    uVar2 = QPixmap::isNull();
    if ((uVar2 & 1) == 0) {
      QStylePainter::QStylePainter
                ((QStylePainter *)this_00,
                 (QWidget *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QWidget::height((QWidget *)0x7bc854);
      QPixmap::height();
      QPainter::drawPixmap
                (in_RSI,(int)((ulong)this_00 >> 0x20),(int)this_00,
                 (QPixmap *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      QStylePainter::~QStylePainter((QStylePainter *)0x7bc88f);
    }
    QPixmap::~QPixmap((QPixmap *)&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizard::paintEvent(QPaintEvent * event)
{
    Q_D(QWizard);
    if (d->wizStyle == MacStyle && currentPage()) {
        QPixmap backgroundPixmap = currentPage()->pixmap(BackgroundPixmap);
        if (backgroundPixmap.isNull())
            return;

        QStylePainter painter(this);
        painter.drawPixmap(0, (height() - backgroundPixmap.height()) / 2, backgroundPixmap);
    }
#if QT_CONFIG(style_windowsvista)
    else if (d->isVistaThemeEnabled()) {
        d->vistaHelper->paintEvent(event);
    }
#else
    Q_UNUSED(event);
#endif
}